

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O0

int SUNRCompareTol(realtype a,realtype b,realtype tol)

{
  int iVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  realtype norm;
  realtype diff;
  double local_48;
  double local_38;
  int local_4;
  
  if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
    iVar1 = sunIsNaN(in_XMM0_Qa);
    if ((iVar1 == 0) && (iVar1 = sunIsNaN(in_XMM1_Qa), iVar1 == 0)) {
      iVar1 = sunIsInf(in_XMM0_Qa);
      if ((iVar1 == 0) && (iVar1 = sunIsInf(in_XMM1_Qa), iVar1 == 0)) {
        if (1.79769313486232e+308 <= ABS(in_XMM0_Qa + in_XMM1_Qa)) {
          local_38 = 1.79769313486232e+308;
        }
        else {
          local_38 = ABS(in_XMM0_Qa + in_XMM1_Qa);
        }
        if (2.220446049250313e-15 <= in_XMM2_Qa * local_38) {
          local_48 = in_XMM2_Qa * local_38;
        }
        else {
          local_48 = 2.220446049250313e-15;
        }
        return (uint)(local_48 <= ABS(in_XMM0_Qa - in_XMM1_Qa));
      }
      return 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

booleantype SUNRCompareTol(realtype a, realtype b, realtype tol)
{
  realtype diff;
  realtype norm;

  /* If a and b are exactly equal.
   * This also covers the case where a and b are both inf under IEEE 754.
   */
  if (a == b) return(SUNFALSE);

  /* If a or b are NaN */
  if (sunIsNaN(a) || sunIsNaN(b)) return(SUNTRUE);

  /* If one of a or b are Inf (since we handled both being inf above) */
  if (sunIsInf(a) || sunIsInf(b)) return(SUNTRUE);

  diff = SUNRabs(a - b);
  norm = SUNMIN(SUNRabs(a + b), BIG_REAL);

  /* When |a + b| is very small (less than 10*UNIT_ROUNDOFF) or zero, we use an
   * absolute difference:
   *    |a - b| >= 10*UNIT_ROUNDOFF
   * Otherwise we use a relative difference:
   *    |a - b| < tol * |a + b|
   * The choice to use |a + b| over max(a, b)
   * is arbitrary, as is the choice to use
   * 10*UNIT_ROUNDOFF.
   */
  return(diff >= SUNMAX(10*UNIT_ROUNDOFF, tol*norm));
}